

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O1

void __thiscall wasm::PrintSExpression::visitTry(PrintSExpression *this,Try *curr)

{
  ostream *poVar1;
  Name *pNVar2;
  size_t sVar3;
  ostream *in_RCX;
  char *__function;
  long lVar4;
  ulong uVar5;
  Name name;
  Name name_00;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  this->controlFlowDepth = this->controlFlowDepth + 1;
  local_50 = (long *)CONCAT71(local_50._1_7_,0x28);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
  printExpressionContents(this,(Expression *)curr);
  incIndent(this);
  poVar1 = this->o;
  local_50 = local_40;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)this->indent);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  local_50 = (long *)CONCAT71(local_50._1_7_,0x28);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
  poVar1 = this->o;
  Colors::outputColorCode(poVar1,"\x1b[35m");
  Colors::outputColorCode(poVar1,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"do",2);
  Colors::outputColorCode(poVar1,"\x1b[0m");
  incIndent(this);
  maybePrintImplicitBlock(this,curr->body,true);
  decIndent(this);
  std::__ostream_insert<char,std::char_traits<char>>(this->o,"\n",1);
  if ((curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements != 0
     ) {
    lVar4 = 8;
    uVar5 = 0;
    do {
      poVar1 = this->o;
      local_50 = local_40;
      std::__cxx11::string::_M_construct((ulong)&local_50,(char)this->indent);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      printDebugDelimiterLocation(this,(Expression *)curr,(Index)uVar5);
      local_50 = (long *)CONCAT71(local_50._1_7_,0x28);
      std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
      poVar1 = this->o;
      Colors::outputColorCode(poVar1,"\x1b[35m");
      Colors::outputColorCode(poVar1,"\x1b[1m");
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,"catch ",6);
      Colors::outputColorCode(poVar1,"\x1b[0m");
      if ((curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements
          <= uVar5) {
        __function = 
        "T &ArenaVectorBase<ArenaVector<wasm::Name>, wasm::Name>::operator[](size_t) const [SubType = ArenaVector<wasm::Name>, T = wasm::Name]"
        ;
LAB_0084fb9e:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xbc,__function);
      }
      pNVar2 = (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.data;
      name.super_IString.str._M_str = (char *)this->o;
      name.super_IString.str._M_len = *(size_t *)((long)&(pNVar2->super_IString).str._M_len + lVar4)
      ;
      anon_unknown_217::printName(*(anon_unknown_217 **)((long)pNVar2 + lVar4 + -8),name,in_RCX);
      incIndent(this);
      if ((curr->catchBodies).
          super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements <=
          uVar5) {
        __function = 
        "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
        ;
        goto LAB_0084fb9e;
      }
      maybePrintImplicitBlock
                (this,(curr->catchBodies).
                      super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                      data[uVar5],true);
      decIndent(this);
      std::__ostream_insert<char,std::char_traits<char>>(this->o,"\n",1);
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar5 < (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                     usedElements);
  }
  if ((curr->catchBodies).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>
      .usedElements -
      (curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.usedElements == 1
     ) {
    poVar1 = this->o;
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)this->indent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    printDebugDelimiterLocation
              (this,(Expression *)curr,
               (Index)(curr->catchTags).super_ArenaVectorBase<ArenaVector<wasm::Name>,_wasm::Name>.
                      usedElements);
    local_50 = (long *)CONCAT71(local_50._1_7_,0x28);
    std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
    poVar1 = this->o;
    Colors::outputColorCode(poVar1,"\x1b[35m");
    Colors::outputColorCode(poVar1,"\x1b[1m");
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"catch_all",9);
    Colors::outputColorCode(poVar1,"\x1b[0m");
    incIndent(this);
    sVar3 = (curr->catchBodies).
            super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
    if (sVar3 == 0) {
      __assert_fail("usedElements > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                    ,0xd0,
                    "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::back() const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                   );
    }
    maybePrintImplicitBlock
              (this,(curr->catchBodies).
                    super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.data
                    [sVar3 - 1],true);
    decIndent(this);
    std::__ostream_insert<char,std::char_traits<char>>(this->o,"\n",1);
  }
  this->controlFlowDepth = this->controlFlowDepth + -1;
  if ((curr->delegateTarget).super_IString.str._M_str != (char *)0x0) {
    poVar1 = this->o;
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)this->indent);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    local_50 = (long *)CONCAT71(local_50._1_7_,0x28);
    std::__ostream_insert<char,std::char_traits<char>>(this->o,(char *)&local_50,1);
    poVar1 = this->o;
    Colors::outputColorCode(poVar1,"\x1b[35m");
    Colors::outputColorCode(poVar1,"\x1b[1m");
    std::__ostream_insert<char,std::char_traits<char>>(poVar1,"delegate ",9);
    Colors::outputColorCode(poVar1,"\x1b[0m");
    if ((curr->delegateTarget).super_IString.str._M_str == DAT_00dbd310) {
      std::ostream::operator<<(this->o,this->controlFlowDepth);
    }
    else {
      name_00.super_IString.str._M_str = (char *)this->o;
      name_00.super_IString.str._M_len = (size_t)(curr->delegateTarget).super_IString.str._M_str;
      anon_unknown_217::printName
                ((anon_unknown_217 *)(curr->delegateTarget).super_IString.str._M_len,name_00,
                 (ostream *)&DELEGATE_CALLER_TARGET);
    }
    std::__ostream_insert<char,std::char_traits<char>>(this->o,")\n",2);
  }
  decIndent(this);
  if (this->full == true) {
    std::__ostream_insert<char,std::char_traits<char>>(this->o," ;; end try",0xb);
  }
  return;
}

Assistant:

void visitTry(Try* curr) {
    controlFlowDepth++;
    o << '(';
    printExpressionContents(curr);
    incIndent();
    doIndent(o, indent);
    o << '(';
    printMedium(o, "do");
    incIndent();
    maybePrintImplicitBlock(curr->body, true);
    decIndent();
    o << "\n";
    for (size_t i = 0; i < curr->catchTags.size(); i++) {
      doIndent(o, indent);
      printDebugDelimiterLocation(curr, i);
      o << '(';
      printMedium(o, "catch ");
      printName(curr->catchTags[i], o);
      incIndent();
      maybePrintImplicitBlock(curr->catchBodies[i], true);
      decIndent();
      o << "\n";
    }
    if (curr->hasCatchAll()) {
      doIndent(o, indent);
      printDebugDelimiterLocation(curr, curr->catchTags.size());
      o << '(';
      printMedium(o, "catch_all");
      incIndent();
      maybePrintImplicitBlock(curr->catchBodies.back(), true);
      decIndent();
      o << "\n";
    }
    controlFlowDepth--;

    if (curr->isDelegate()) {
      doIndent(o, indent);
      o << '(';
      printMedium(o, "delegate ");
      if (curr->delegateTarget == DELEGATE_CALLER_TARGET) {
        o << controlFlowDepth;
      } else {
        printName(curr->delegateTarget, o);
      }
      o << ")\n";
    }
    decIndent();
    if (full) {
      o << " ;; end try";
    }
  }